

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

QString * QCoreApplication::applicationVersion(void)

{
  Type *pTVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *this;
  
  this = in_RDI;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
           operator()(in_RDI);
  if (pTVar1 == (Type *)0x0) {
    QString::QString((QString *)0x12e8a2);
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::operator()
              (in_RDI);
    QString::QString((QString *)this,(QString *)in_RDI);
  }
  return (QString *)this;
}

Assistant:

QString QCoreApplication::applicationVersion()
{
    return coreappdata() ? coreappdata()->applicationVersion : QString();
}